

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  long *plVar2;
  N_Vector yy;
  N_Vector p_Var3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  UserData data;
  void *mem_00;
  long lVar7;
  long lVar8;
  char *pcVar9;
  SUNContext ctx;
  void *mem;
  sunrealtype tret;
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  undefined8 *local_c0;
  N_Vector local_b8;
  void *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  long *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined1 local_78 [8];
  long local_70;
  long local_68;
  long *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar1 = SUNContext_Create(0,&local_d8);
  if ((int)uVar1 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    plVar2 = (long *)N_VNew_Serial(10,local_d8);
    yy = (N_Vector)N_VClone(plVar2);
    p_Var3 = (N_Vector)N_VClone(plVar2);
    plVar4 = (long *)N_VNew_Serial(1,local_d8);
    puVar5 = (undefined8 *)N_VCloneVectorArray(2,yy);
    puVar6 = (undefined8 *)N_VCloneVectorArray(2,p_Var3);
    local_60 = plVar4;
    local_c0 = (undefined8 *)N_VCloneVectorArray(2,plVar4);
    data = (UserData)malloc(0x48);
    data->a = 0.5;
    data->J1 = 1.0;
    data->J2 = 2.0;
    data->m1 = 1.0;
    data->params[0] = 1.0;
    data->params[1] = 1.0;
    data->m2 = 1.0;
    data->l0 = 1.0;
    data->F = 1.0;
    N_VConst(0,plVar2);
    lVar7 = *(long *)(*plVar2 + 0x10);
    *(undefined8 *)(lVar7 + 0x40) = 0;
    *(undefined8 *)(lVar7 + 0x48) = 0;
    *(undefined8 *)(lVar7 + 0x30) = 0;
    *(undefined8 *)(lVar7 + 0x38) = 0;
    puts("\nSlider-Crank example for IDAS:");
    setIC(yy,p_Var3,data);
    N_VConst(0,*puVar5);
    N_VConst(0,*puVar6);
    local_80 = puVar5;
    N_VConst(0,puVar5[1]);
    local_88 = puVar6;
    N_VConst(0,puVar6[1]);
    mem_00 = (void *)IDACreate(local_d8);
    local_b8 = p_Var3;
    local_b0 = mem_00;
    IDAInit(0,mem_00,ressc,yy,p_Var3);
    IDASStolerances(0xa0b5ed8d,0x3e7ad7f29abcaf48,mem_00);
    IDASetUserData(mem_00,data);
    local_90 = plVar2;
    IDASetId(mem_00,plVar2);
    IDASetSuppressAlg(mem_00,1);
    IDASetMaxNumSteps(mem_00,20000);
    lVar7 = SUNDenseMatrix(10,10,local_d8);
    if (lVar7 == 0) {
      main_cold_4();
      return 1;
    }
    lVar8 = SUNLinSol_Dense(yy,lVar7,local_d8);
    if (lVar8 == 0) {
      main_cold_3();
      return 1;
    }
    uVar1 = IDASetLinearSolver(mem_00,lVar8,lVar7);
    if (-1 < (int)uVar1) {
      local_d0 = (double)lVar8;
      local_c8 = (double)lVar7;
      IDASensInit(mem_00,2,1,0,local_80,local_88);
      local_48 = *(undefined4 *)data->params;
      uStack_44 = *(undefined4 *)((long)data->params + 4);
      uStack_40 = *(undefined4 *)(data->params + 1);
      uStack_3c = *(undefined4 *)((long)data->params + 0xc);
      IDASetSensParams(mem_00,data->params,&local_48,0);
      IDASensEEtolerances(mem_00);
      IDASetSensErrCon(mem_00,1);
      plVar2 = local_60;
      N_VConst(0,local_60);
      IDAQuadInit(mem_00,rhsQ,plVar2);
      IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,mem_00);
      IDASetQuadErrCon(mem_00,1);
      puVar5 = local_c0;
      N_VConst(0,*local_c0);
      N_VConst(0,puVar5[1]);
      IDAQuadSensInit(mem_00,rhsQS,puVar5);
      local_58 = 0x3e45798ee2308c3a;
      uStack_50 = 0x3e45798ee2308c3a;
      IDAQuadSensSStolerances(0xa0b5ed8d,mem_00);
      IDASetQuadSensErrCon(mem_00,1);
      printf("\nForward integration ... ");
      uVar1 = IDASolve(0,mem_00,local_78,yy,local_b8,1);
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDASolve",(ulong)uVar1
               );
        return 1;
      }
      puts("done!");
      uVar1 = PrintFinalStats(mem_00);
      if ((int)uVar1 < 0) {
        pcVar9 = "PrintFinalStats";
        goto LAB_00102eee;
      }
      IDAGetQuad(mem_00,local_78,plVar2);
      puts("--------------------------------------------");
      printf("  G = %24.16f\n",(int)**(undefined8 **)(*plVar2 + 0x10));
      puts("--------------------------------------------\n");
      puVar5 = local_c0;
      IDAGetQuadSens(mem_00,local_78,local_c0);
      puts("-------------F O R W A R D------------------");
      printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar5 + 0x10),
             **(undefined8 **)(*(long *)puVar5[1] + 0x10));
      puts("--------------------------------------------\n");
      IDAFree(&local_b0);
      SUNLinSolFree(local_d0);
      SUNMatDestroy(local_c8);
      *(undefined4 *)data->params = 0;
      *(undefined4 *)((long)data->params + 4) = 0x3ff00000;
      *(undefined4 *)(data->params + 1) = 0;
      *(undefined4 *)((long)data->params + 0xc) = 0x3ff00000;
      local_b0 = (void *)IDACreate(local_d8);
      p_Var3 = local_b8;
      setIC(yy,local_b8,data);
      IDAInit(0,local_b0,ressc,yy,p_Var3);
      IDASStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,local_b0);
      IDASetUserData(local_b0,data);
      IDASetId(local_b0,local_90);
      IDASetSuppressAlg(local_b0,1);
      lVar7 = SUNDenseMatrix(10,10,local_d8);
      if (lVar7 == 0) {
        main_cold_2();
        return 1;
      }
      lVar8 = SUNLinSol_Dense(yy,lVar7,local_d8);
      if (lVar8 == 0) {
        main_cold_1();
        return 1;
      }
      uVar1 = IDASetLinearSolver(local_b0,lVar8,lVar7);
      if (-1 < (int)uVar1) {
        N_VConst(0,plVar2);
        local_68 = lVar7;
        IDAQuadInit(local_b0,rhsQ,plVar2);
        IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,local_b0);
        IDASetQuadErrCon(local_b0,1);
        p_Var3 = local_b8;
        local_70 = lVar8;
        IDASolve(0,local_b0,local_78,yy,local_b8,1);
        IDAGetQuad(local_b0,local_78,plVar2);
        local_d0 = **(double **)(*plVar2 + 0x10);
        data->params[0] = data->params[0] + -1e-05;
        setIC(yy,p_Var3,data);
        IDAReInit(0,local_b0,yy,p_Var3);
        N_VConst(0,plVar2);
        IDAQuadReInit(local_b0,plVar2);
        IDASolve(0,local_b0,local_78,yy,p_Var3,1);
        IDAGetQuad(local_b0,local_78,plVar2);
        local_c8 = **(double **)(*plVar2 + 0x10);
        data->params[0] = data->params[0] + 2e-05;
        setIC(yy,p_Var3,data);
        IDAReInit(0,local_b0,yy,p_Var3);
        N_VConst(0,plVar2);
        IDAQuadReInit(local_b0,plVar2);
        IDASolve(0,local_b0,local_78,yy,p_Var3,1);
        IDAGetQuad(local_b0,local_78,plVar2);
        local_98 = **(double **)(*plVar2 + 0x10);
        data->params[0] = 1.0;
        data->params[1] = data->params[1] + -1e-05;
        setIC(yy,p_Var3,data);
        IDAReInit(0,local_b0,yy,p_Var3);
        N_VConst(0,plVar2);
        IDAQuadReInit(local_b0,plVar2);
        IDASolve(0,local_b0,local_78,yy,p_Var3,1);
        IDAGetQuad(local_b0,local_78,plVar2);
        local_a0 = **(double **)(*plVar2 + 0x10);
        data->params[1] = data->params[1] + 2e-05;
        setIC(yy,p_Var3,data);
        IDAReInit(0,local_b0,yy,p_Var3);
        N_VConst(0,plVar2);
        IDAQuadReInit(local_b0,plVar2);
        IDASolve(0,local_b0,local_78,yy,p_Var3,1);
        IDAGetQuad(local_b0,local_78,plVar2);
        local_a8 = **(double **)(*plVar2 + 0x10);
        IDAFree(&local_b0);
        SUNLinSolFree(local_70);
        SUNMatDestroy(local_68);
        puts("\n\n   Checking using Finite Differences \n");
        puts("---------------BACKWARD------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_d0 - local_c8) / 1e-05,0),
               (local_d0 - local_a0) / 1e-05);
        puts("-----------------------------------------\n");
        puts("---------------FORWARD-------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_98 - local_d0) / 1e-05,0),
               (local_a8 - local_d0) / 1e-05);
        puts("-----------------------------------------\n");
        puts("--------------CENTERED-------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_98 - local_c8) / 2e-05,0),
               (local_a8 - local_a0) / 2e-05);
        puts("-----------------------------------------\n");
        free(data);
        N_VDestroy(local_90);
        N_VDestroy(yy);
        N_VDestroy(p_Var3);
        N_VDestroy(plVar2);
        N_VDestroyVectorArray(local_80,2);
        N_VDestroyVectorArray(local_88,2);
        N_VDestroyVectorArray(local_c0,2);
        SUNContext_Free(&local_d8);
        return 0;
      }
    }
    pcVar9 = "IDASetLinearSolver";
  }
LAB_00102eee:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id, q, *yyS, *ypS, *qS;
  sunrealtype tret;
  sunrealtype pbar[2];
  sunrealtype dp, G, Gm[2], Gp[2];
  int retval, is;
  sunrealtype atolS[NP];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  id = N_VNew_Serial(NEQ, ctx);
  yy = N_VClone(id);
  yp = N_VClone(id);
  q  = N_VNew_Serial(1, ctx);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  qS  = N_VCloneVectorArray(NP, q);

  data = (UserData)malloc(sizeof *data);

  data->a         = 0.5; /* half-length of crank */
  data->J1        = 1.0; /* crank moment of inertia */
  data->m2        = 1.0; /* mass of connecting rod */
  data->m1        = 1.0;
  data->J2        = 2.0; /* moment of inertia of connecting rod */
  data->params[0] = 1.0; /* spring constant */
  data->params[1] = 1.0; /* damper constant */
  data->l0        = 1.0; /* spring free length */
  data->F         = 1.0; /* external constant force */

  N_VConst(ONE, id);
  NV_Ith_S(id, 9) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 6) = ZERO;

  printf("\nSlider-Crank example for IDAS:\n");

  /* Consistent IC*/
  setIC(yy, yp, data);

  for (is = 0; is < NP; is++)
  {
    N_VConst(ZERO, yyS[is]);
    N_VConst(ZERO, ypS[is]);
  }

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLF, ATOLF);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);
  retval = IDASetMaxNumSteps(mem, 20000);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval  = IDASensInit(mem, NP, IDA_SIMULTANEOUS, NULL, yyS, ypS);
  pbar[0] = data->params[0];
  pbar[1] = data->params[1];
  retval  = IDASetSensParams(mem, data->params, pbar, NULL);
  retval  = IDASensEEtolerances(mem);
  IDASetSensErrCon(mem, SUNTRUE);

  N_VConst(ZERO, q);
  retval = IDAQuadInit(mem, rhsQ, q);
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  retval = IDASetQuadErrCon(mem, SUNTRUE);

  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }
  retval   = IDAQuadSensInit(mem, rhsQS, qS);
  atolS[0] = atolS[1] = ATOLQ;
  retval              = IDAQuadSensSStolerances(mem, RTOLQ, atolS);
  retval              = IDASetQuadSensErrCon(mem, SUNTRUE);

  /* Perform forward run */
  printf("\nForward integration ... ");

  retval = IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  if (check_retval(&retval, "IDASolve", 1)) { return (1); }

  printf("done!\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAGetQuad(mem, &tret, q);
  printf("--------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  G = %24.16Lf\n", Ith(q, 1));
#else
  printf("  G = %24.16f\n", Ith(q, 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAGetQuadSens(mem, &tret, qS);
  printf("-------------F O R W A R D------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  /* Finite differences for dG/dp */
  dp              = 0.00001;
  data->params[0] = ONE;
  data->params[1] = ONE;

  mem = IDACreate(ctx);

  setIC(yy, yp, data);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLFD, ATOLFD);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  N_VConst(ZERO, q);
  IDAQuadInit(mem, rhsQ, q);
  IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  IDASetQuadErrCon(mem, SUNTRUE);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);

  IDAGetQuad(mem, &tret, q);
  G = Ith(q, 1);
  /*printf("  G  =%12.6e\n", Ith(q,1));*/

  /******************************
  * BACKWARD for k
  ******************************/
  data->params[0] -= dp;
  setIC(yy, yp, data);

  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[0] = Ith(q, 1);
  /*printf("Gm[0]=%12.6e\n", Ith(q,1));*/

  /****************************
  * FORWARD for k *
  ****************************/
  data->params[0] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[0] = Ith(q, 1);
  /*printf("Gp[0]=%12.6e\n", Ith(q,1));*/

  /* Backward for c */
  data->params[0] = ONE;
  data->params[1] -= dp;
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[1] = Ith(q, 1);

  /* Forward for c */
  data->params[1] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[1] = Ith(q, 1);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  printf("\n\n   Checking using Finite Differences \n\n");

  printf("---------------BACKWARD------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("---------------FORWARD-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("--------------CENTERED-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#endif
  printf("-----------------------------------------\n\n");

  /* Free memory */
  free(data);

  N_VDestroy(id);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);

  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  SUNContext_Free(&ctx);

  return (0);
}